

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int ipc_helper(int listen_after_write)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  uint uVar3;
  int extraout_EAX_01;
  uv_tcp_t *puVar4;
  uv_pipe_t *puVar5;
  tcp_conn *ptVar6;
  uv_loop_t *puVar7;
  undefined8 uVar8;
  void *pvVar9;
  undefined8 *extraout_RDX;
  undefined1 *puVar10;
  uv_loop_t *puVar11;
  char *pcVar12;
  uv_pipe_t *puVar13;
  uv_write_t *puVar14;
  ulong uVar15;
  sockaddr_in addr;
  undefined1 auStack_110 [16];
  uv_pipe_t *puStack_100;
  undefined1 auStack_f8 [16];
  undefined1 auStack_e8 [16];
  uv_pipe_t *puStack_d8;
  undefined1 auStack_c8 [8];
  code *pcStack_c0;
  uv_pipe_t *puStack_b8;
  undefined1 auStack_80 [16];
  uv_pipe_t *puStack_70;
  undefined1 auStack_68 [16];
  uv_pipe_t *puStack_58;
  undefined1 auStack_48 [8];
  undefined8 uStack_40;
  undefined1 local_30 [16];
  undefined1 local_20 [16];
  
  puVar5 = (uv_pipe_t *)(ulong)(uint)listen_after_write;
  pcVar12 = "0.0.0.0";
  iVar2 = 0x23a3;
  uStack_40 = (code *)0x162886;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_30);
  if (iVar1 == 0) {
    uStack_40 = (code *)0x162893;
    puVar4 = (uv_tcp_t *)uv_default_loop();
    iVar2 = 0x2e6b38;
    uStack_40 = (code *)0x1628a7;
    iVar1 = uv_pipe_init(puVar4,&channel,1);
    if (iVar1 != 0) goto LAB_00162a30;
    iVar2 = 0;
    uStack_40 = (code *)0x1628c0;
    uv_pipe_open(&channel);
    puVar13 = &channel;
    uStack_40 = (code *)0x1628c8;
    iVar1 = uv_is_readable();
    puVar4 = (uv_tcp_t *)puVar13;
    if (iVar1 != 1) goto LAB_00162a35;
    puVar13 = &channel;
    uStack_40 = (code *)0x1628dd;
    iVar1 = uv_is_writable();
    puVar4 = (uv_tcp_t *)puVar13;
    if (iVar1 != 1) goto LAB_00162a3a;
    puVar13 = &channel;
    uStack_40 = (code *)0x1628f2;
    iVar1 = uv_is_closing();
    puVar4 = (uv_tcp_t *)puVar13;
    if (iVar1 != 0) goto LAB_00162a3f;
    uStack_40 = (code *)0x1628ff;
    puVar4 = (uv_tcp_t *)uv_default_loop();
    iVar2 = 0x2e6c40;
    uStack_40 = (code *)0x16290e;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00162a44;
    puVar4 = &tcp_server;
    puVar10 = local_30;
    uStack_40 = (code *)0x162929;
    iVar1 = uv_tcp_bind(&tcp_server,puVar10,0);
    iVar2 = (int)puVar10;
    if (iVar1 != 0) goto LAB_00162a49;
    if (listen_after_write != 0) {
LAB_00162955:
      uStack_40 = (code *)0x162966;
      local_20 = uv_buf_init("hello\n",6);
      puVar14 = &write_req;
      iVar2 = 0x2e6b38;
      uStack_40 = (code *)0x162997;
      iVar1 = uv_write2(&write_req,&channel,local_20,1,&tcp_server,0);
      puVar4 = (uv_tcp_t *)puVar14;
      if (iVar1 != 0) goto LAB_00162a4e;
      if (listen_after_write == 0) {
LAB_001629c3:
        uStack_40 = (code *)0x1629c8;
        notify_parent_process();
        uStack_40 = (code *)0x1629cd;
        puVar4 = (uv_tcp_t *)uv_default_loop();
        iVar2 = 0;
        uStack_40 = (code *)0x1629d7;
        iVar1 = uv_run();
        if (iVar1 != 0) goto LAB_00162a53;
        if (connection_accepted == '\0') goto LAB_00162a58;
        if (close_cb_called != 3) goto LAB_00162a5d;
        uStack_40 = (code *)0x1629f2;
        puVar5 = (uv_pipe_t *)uv_default_loop();
        uStack_40 = (code *)0x162a06;
        uv_walk(puVar5,close_walk_cb,0);
        iVar2 = 0;
        uStack_40 = (code *)0x162a10;
        uv_run(puVar5);
        uStack_40 = (code *)0x162a15;
        puVar4 = (uv_tcp_t *)uv_default_loop();
        uStack_40 = (code *)0x162a1d;
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_00162a62;
      }
      puVar4 = &tcp_server;
      iVar2 = 0x80;
      uStack_40 = (code *)0x1629bb;
      iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection);
      if (iVar1 == 0) goto LAB_001629c3;
      goto LAB_00162a67;
    }
    puVar4 = &tcp_server;
    iVar2 = 0x80;
    uStack_40 = (code *)0x16294d;
    iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection);
    if (iVar1 == 0) goto LAB_00162955;
  }
  else {
    uStack_40 = (code *)0x162a30;
    ipc_helper_cold_1();
    puVar4 = (uv_tcp_t *)pcVar12;
LAB_00162a30:
    uStack_40 = (code *)0x162a35;
    ipc_helper_cold_2();
LAB_00162a35:
    uStack_40 = (code *)0x162a3a;
    ipc_helper_cold_3();
LAB_00162a3a:
    uStack_40 = (code *)0x162a3f;
    ipc_helper_cold_4();
LAB_00162a3f:
    uStack_40 = (code *)0x162a44;
    ipc_helper_cold_5();
LAB_00162a44:
    uStack_40 = (code *)0x162a49;
    ipc_helper_cold_6();
LAB_00162a49:
    uStack_40 = (code *)0x162a4e;
    ipc_helper_cold_7();
LAB_00162a4e:
    uStack_40 = (code *)0x162a53;
    ipc_helper_cold_9();
LAB_00162a53:
    uStack_40 = (code *)0x162a58;
    ipc_helper_cold_11();
LAB_00162a58:
    uStack_40 = (code *)0x162a5d;
    ipc_helper_cold_12();
LAB_00162a5d:
    uStack_40 = (code *)0x162a62;
    ipc_helper_cold_13();
LAB_00162a62:
    uStack_40 = (code *)0x162a67;
    ipc_helper_cold_14();
LAB_00162a67:
    uStack_40 = (code *)0x162a6c;
    ipc_helper_cold_10();
  }
  uStack_40 = ipc_on_connection;
  ipc_helper_cold_8();
  if (connection_accepted != '\0') {
    return extraout_EAX;
  }
  if (iVar2 == 0) {
    if (puVar4 != &tcp_server) goto LAB_00162b36;
    puStack_58 = (uv_pipe_t *)0x162aad;
    iVar1 = uv_tcp_init(tcp_server.loop,0x2e6f20);
    if (iVar1 != 0) goto LAB_00162b3b;
    puStack_58 = (uv_pipe_t *)0x162ac8;
    iVar1 = uv_accept(&tcp_server,0x2e6f20);
    if (iVar1 != 0) goto LAB_00162b40;
    puStack_58 = (uv_pipe_t *)0x162adf;
    uv_close(0x2e6f20,close_cb);
    puStack_58 = (uv_pipe_t *)0x162af0;
    _auStack_48 = uv_buf_init("accepted_connection\n",0x14);
    puStack_58 = (uv_pipe_t *)0x162b21;
    iVar1 = uv_write2(&conn_notify_req,&channel,auStack_48,1,0,conn_notify_write_cb);
    if (iVar1 == 0) {
      connection_accepted = 1;
      return 0;
    }
  }
  else {
    puStack_58 = (uv_pipe_t *)0x162b36;
    ipc_on_connection_cold_1();
LAB_00162b36:
    puStack_58 = (uv_pipe_t *)0x162b3b;
    ipc_on_connection_cold_2();
LAB_00162b3b:
    puStack_58 = (uv_pipe_t *)0x162b40;
    ipc_on_connection_cold_3();
LAB_00162b40:
    puStack_58 = (uv_pipe_t *)0x162b45;
    ipc_on_connection_cold_4();
  }
  puStack_58 = (uv_pipe_t *)ipc_helper_tcp_connection;
  ipc_on_connection_cold_5();
  puStack_70 = (uv_pipe_t *)0x162b54;
  puStack_58 = puVar5;
  ptVar6 = (tcp_conn *)uv_default_loop();
  iVar1 = 0x2e6b38;
  puStack_70 = (uv_pipe_t *)0x162b68;
  iVar2 = uv_pipe_init(ptVar6,&channel,1);
  if (iVar2 == 0) {
    puVar5 = &channel;
    iVar1 = 0;
    puStack_70 = (uv_pipe_t *)0x162b81;
    uv_pipe_open(&channel);
    puVar13 = &channel;
    puStack_70 = (uv_pipe_t *)0x162b89;
    iVar2 = uv_is_readable();
    ptVar6 = (tcp_conn *)puVar13;
    if (iVar2 != 1) goto LAB_00162d08;
    puVar13 = &channel;
    puStack_70 = (uv_pipe_t *)0x162b9e;
    iVar2 = uv_is_writable();
    ptVar6 = (tcp_conn *)puVar13;
    if (iVar2 != 1) goto LAB_00162d0d;
    puVar13 = &channel;
    puStack_70 = (uv_pipe_t *)0x162bb3;
    iVar2 = uv_is_closing();
    ptVar6 = (tcp_conn *)puVar13;
    if (iVar2 != 0) goto LAB_00162d12;
    puStack_70 = (uv_pipe_t *)0x162bc0;
    ptVar6 = (tcp_conn *)uv_default_loop();
    iVar1 = 0x2e6c40;
    puStack_70 = (uv_pipe_t *)0x162bcf;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00162d17;
    pcVar12 = "0.0.0.0";
    iVar1 = 0x23a3;
    puStack_70 = (uv_pipe_t *)0x162beb;
    iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_68);
    ptVar6 = (tcp_conn *)pcVar12;
    if (iVar2 != 0) goto LAB_00162d1c;
    puVar4 = &tcp_server;
    puStack_70 = (uv_pipe_t *)0x162c04;
    iVar1 = (int)auStack_68;
    iVar2 = uv_tcp_bind(&tcp_server,auStack_68,0);
    ptVar6 = (tcp_conn *)puVar4;
    if (iVar2 != 0) goto LAB_00162d21;
    puVar4 = &tcp_server;
    iVar1 = 0x80;
    puStack_70 = (uv_pipe_t *)0x162c24;
    iVar2 = uv_listen(&tcp_server,0x80,ipc_on_connection_tcp_conn);
    ptVar6 = (tcp_conn *)puVar4;
    if (iVar2 != 0) goto LAB_00162d26;
    puStack_70 = (uv_pipe_t *)0x162c31;
    ptVar6 = (tcp_conn *)uv_default_loop();
    iVar1 = 0x2e6f20;
    puStack_70 = (uv_pipe_t *)0x162c40;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00162d2b;
    ptVar6 = (tcp_conn *)0x194b6a;
    iVar1 = 0x23a3;
    puStack_70 = (uv_pipe_t *)0x162c5c;
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_68);
    if (iVar2 != 0) goto LAB_00162d30;
    ptVar6 = &conn;
    iVar1 = 0x2e6f20;
    puStack_70 = (uv_pipe_t *)0x162c81;
    iVar2 = uv_tcp_connect(&conn,0x2e6f20,auStack_68,connect_child_process_cb);
    if (iVar2 != 0) goto LAB_00162d35;
    puStack_70 = (uv_pipe_t *)0x162c8e;
    ptVar6 = (tcp_conn *)uv_default_loop();
    iVar1 = 0;
    puStack_70 = (uv_pipe_t *)0x162c98;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_00162d3a;
    if (tcp_conn_read_cb_called != 1) goto LAB_00162d3f;
    if (tcp_conn_write_cb_called != 1) goto LAB_00162d44;
    if (close_cb_called != 4) goto LAB_00162d49;
    puStack_70 = (uv_pipe_t *)0x162ccc;
    puVar5 = (uv_pipe_t *)uv_default_loop();
    puStack_70 = (uv_pipe_t *)0x162ce0;
    uv_walk(puVar5,close_walk_cb,0);
    iVar1 = 0;
    puStack_70 = (uv_pipe_t *)0x162cea;
    uv_run(puVar5);
    puStack_70 = (uv_pipe_t *)0x162cef;
    ptVar6 = (tcp_conn *)uv_default_loop();
    puStack_70 = (uv_pipe_t *)0x162cf7;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_70 = (uv_pipe_t *)0x162d08;
    ipc_helper_tcp_connection_cold_1();
LAB_00162d08:
    puStack_70 = (uv_pipe_t *)0x162d0d;
    ipc_helper_tcp_connection_cold_2();
LAB_00162d0d:
    puStack_70 = (uv_pipe_t *)0x162d12;
    ipc_helper_tcp_connection_cold_3();
LAB_00162d12:
    puStack_70 = (uv_pipe_t *)0x162d17;
    ipc_helper_tcp_connection_cold_4();
LAB_00162d17:
    puStack_70 = (uv_pipe_t *)0x162d1c;
    ipc_helper_tcp_connection_cold_5();
LAB_00162d1c:
    puStack_70 = (uv_pipe_t *)0x162d21;
    ipc_helper_tcp_connection_cold_6();
LAB_00162d21:
    puStack_70 = (uv_pipe_t *)0x162d26;
    ipc_helper_tcp_connection_cold_7();
LAB_00162d26:
    puStack_70 = (uv_pipe_t *)0x162d2b;
    ipc_helper_tcp_connection_cold_8();
LAB_00162d2b:
    puStack_70 = (uv_pipe_t *)0x162d30;
    ipc_helper_tcp_connection_cold_9();
LAB_00162d30:
    puStack_70 = (uv_pipe_t *)0x162d35;
    ipc_helper_tcp_connection_cold_10();
LAB_00162d35:
    puStack_70 = (uv_pipe_t *)0x162d3a;
    ipc_helper_tcp_connection_cold_11();
LAB_00162d3a:
    puStack_70 = (uv_pipe_t *)0x162d3f;
    ipc_helper_tcp_connection_cold_12();
LAB_00162d3f:
    puStack_70 = (uv_pipe_t *)0x162d44;
    ipc_helper_tcp_connection_cold_13();
LAB_00162d44:
    puStack_70 = (uv_pipe_t *)0x162d49;
    ipc_helper_tcp_connection_cold_14();
LAB_00162d49:
    puStack_70 = (uv_pipe_t *)0x162d4e;
    ipc_helper_tcp_connection_cold_15();
  }
  puStack_70 = (uv_pipe_t *)ipc_on_connection_tcp_conn;
  ipc_helper_tcp_connection_cold_16();
  puStack_70 = puVar5;
  if (iVar1 == 0) {
    puVar14 = (uv_write_t *)ptVar6;
    if (ptVar6 != (tcp_conn *)&tcp_server) goto LAB_00162e28;
    puVar14 = (uv_write_t *)0xf8;
    puVar7 = (uv_loop_t *)malloc(0xf8);
    if (puVar7 == (uv_loop_t *)0x0) goto LAB_00162e2d;
    puVar11 = puVar7;
    puVar14 = (uv_write_t *)tcp_server.loop;
    iVar2 = uv_tcp_init();
    iVar1 = (int)puVar11;
    if (iVar2 != 0) goto LAB_00162e32;
    puVar4 = &tcp_server;
    puVar11 = puVar7;
    iVar2 = uv_accept();
    iVar1 = (int)puVar11;
    puVar14 = (uv_write_t *)puVar4;
    if (iVar2 != 0) goto LAB_00162e37;
    auStack_80 = uv_buf_init("hello\n",6);
    puVar14 = &conn_notify_req;
    iVar1 = 0x2e6b38;
    iVar2 = uv_write2(&conn_notify_req,&channel,auStack_80,1,puVar7,0);
    if (iVar2 != 0) goto LAB_00162e3c;
    iVar1 = 0x16357c;
    puVar14 = (uv_write_t *)puVar7;
    iVar2 = uv_read_start(puVar7,on_read_alloc,on_tcp_child_process_read);
    if (iVar2 == 0) {
      iVar1 = uv_close(puVar7,close_cb);
      return iVar1;
    }
  }
  else {
    ipc_on_connection_tcp_conn_cold_1();
    puVar14 = (uv_write_t *)ptVar6;
LAB_00162e28:
    ipc_on_connection_tcp_conn_cold_2();
LAB_00162e2d:
    ipc_on_connection_tcp_conn_cold_7();
LAB_00162e32:
    ipc_on_connection_tcp_conn_cold_3();
LAB_00162e37:
    ipc_on_connection_tcp_conn_cold_4();
LAB_00162e3c:
    ipc_on_connection_tcp_conn_cold_5();
  }
  ipc_on_connection_tcp_conn_cold_6();
  if (iVar1 == 0) {
    iVar1 = uv_read_start(((uv_loop_t *)puVar14)->pending_queue[0],on_read_alloc,
                          on_tcp_child_process_read);
    if (iVar1 == 0) {
      return extraout_EAX_00;
    }
  }
  else {
    connect_child_process_cb_cold_1();
  }
  connect_child_process_cb_cold_2();
  memset(buffer,0x2e,100000);
  large_buf = (uv_buf_t)uv_buf_init(buffer,100000);
  uVar8 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar8,&channel,1);
  if (iVar1 == 0) {
    puVar5 = &channel;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_00162f72;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00162f77;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00162f7c;
    uVar3 = write_until_data_queued();
    if (uVar3 != 0) {
      send_handle_and_close();
    }
    uVar8 = uv_default_loop();
    iVar1 = uv_run(uVar8,0);
    if (iVar1 != 0) goto LAB_00162f81;
    if (closed_handle_write != '\0') {
      puVar5 = (uv_pipe_t *)uv_default_loop();
      uv_walk(puVar5,close_walk_cb,0);
      uv_run(puVar5,0);
      uVar8 = uv_default_loop();
      iVar1 = uv_loop_close(uVar8);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162f8b;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar5 = (uv_pipe_t *)buffer;
LAB_00162f72:
    ipc_helper_closed_handle_cold_2();
LAB_00162f77:
    ipc_helper_closed_handle_cold_3();
LAB_00162f7c:
    ipc_helper_closed_handle_cold_4();
LAB_00162f81:
    ipc_helper_closed_handle_cold_5();
  }
  ipc_helper_closed_handle_cold_6();
LAB_00162f8b:
  ipc_helper_closed_handle_cold_7();
  uVar15 = 0;
  puVar13 = (uv_pipe_t *)write_reqs;
  puStack_b8 = puVar5;
  do {
    pcStack_c0 = (code *)0x162fce;
    iVar1 = uv_write(puVar13,&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar1 != 0) {
      pcStack_c0 = send_handle_and_close;
      write_until_data_queued_cold_1();
      puStack_d8 = (uv_pipe_t *)0x163009;
      uVar8 = uv_default_loop();
      puStack_d8 = (uv_pipe_t *)0x163018;
      iVar1 = uv_tcp_init(uVar8,&tcp_server);
      if (iVar1 == 0) {
        puStack_d8 = (uv_pipe_t *)0x163032;
        iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_c8);
        if (iVar1 != 0) goto LAB_00163096;
        puStack_d8 = (uv_pipe_t *)0x163049;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_c8,0);
        if (iVar1 != 0) goto LAB_0016309b;
        puStack_d8 = (uv_pipe_t *)0x16307a;
        iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
        if (iVar1 == 0) {
          puStack_d8 = (uv_pipe_t *)0x16308c;
          iVar1 = uv_close(&tcp_server,0);
          return iVar1;
        }
      }
      else {
        puStack_d8 = (uv_pipe_t *)0x163096;
        send_handle_and_close_cold_1();
LAB_00163096:
        puStack_d8 = (uv_pipe_t *)0x16309b;
        send_handle_and_close_cold_2();
LAB_0016309b:
        puStack_d8 = (uv_pipe_t *)0x1630a0;
        send_handle_and_close_cold_3();
      }
      puStack_d8 = (uv_pipe_t *)ipc_helper_bind_twice;
      send_handle_and_close_cold_4();
      puStack_100 = (uv_pipe_t *)0x1630c0;
      puStack_d8 = puVar13;
      iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_e8);
      if (iVar1 == 0) {
        puStack_100 = (uv_pipe_t *)0x1630cd;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x1630e1;
        iVar1 = uv_pipe_init(uVar8,&channel,1);
        if (iVar1 != 0) goto LAB_0016326a;
        puVar13 = &channel;
        puStack_100 = (uv_pipe_t *)0x1630fa;
        uv_pipe_open(&channel,0);
        puStack_100 = (uv_pipe_t *)0x163102;
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_0016326f;
        puStack_100 = (uv_pipe_t *)0x163117;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_00163274;
        puStack_100 = (uv_pipe_t *)0x16312c;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_00163279;
        puStack_100 = (uv_pipe_t *)0x163145;
        auStack_f8 = uv_buf_init("hello\n",6);
        puStack_100 = (uv_pipe_t *)0x163153;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x163162;
        iVar1 = uv_tcp_init(uVar8,&tcp_server);
        if (iVar1 != 0) goto LAB_0016327e;
        puStack_100 = (uv_pipe_t *)0x16316f;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x16317e;
        iVar1 = uv_tcp_init(uVar8,&tcp_server2);
        if (iVar1 != 0) goto LAB_00163283;
        puStack_100 = (uv_pipe_t *)0x163199;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_e8,0);
        if (iVar1 != 0) goto LAB_00163288;
        puStack_100 = (uv_pipe_t *)0x1631b4;
        iVar1 = uv_tcp_bind(&tcp_server2,auStack_e8,0);
        if (iVar1 != 0) goto LAB_0016328d;
        puStack_100 = (uv_pipe_t *)0x1631e1;
        iVar1 = uv_write2(&write_req,&channel,auStack_f8,1,&tcp_server,0);
        if (iVar1 != 0) goto LAB_00163292;
        puStack_100 = (uv_pipe_t *)0x16320e;
        iVar1 = uv_write2(&write_req2,&channel,auStack_f8,1,&tcp_server2,0);
        if (iVar1 != 0) goto LAB_00163297;
        puStack_100 = (uv_pipe_t *)0x16321b;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x163225;
        iVar1 = uv_run(uVar8,0);
        if (iVar1 != 0) goto LAB_0016329c;
        puStack_100 = (uv_pipe_t *)0x16322e;
        puVar13 = (uv_pipe_t *)uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x163242;
        uv_walk(puVar13,close_walk_cb,0);
        puStack_100 = (uv_pipe_t *)0x16324c;
        uv_run(puVar13,0);
        puStack_100 = (uv_pipe_t *)0x163251;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x163259;
        iVar1 = uv_loop_close(uVar8);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        puStack_100 = (uv_pipe_t *)0x16326a;
        ipc_helper_bind_twice_cold_1();
LAB_0016326a:
        puStack_100 = (uv_pipe_t *)0x16326f;
        ipc_helper_bind_twice_cold_2();
LAB_0016326f:
        puStack_100 = (uv_pipe_t *)0x163274;
        ipc_helper_bind_twice_cold_3();
LAB_00163274:
        puStack_100 = (uv_pipe_t *)0x163279;
        ipc_helper_bind_twice_cold_4();
LAB_00163279:
        puStack_100 = (uv_pipe_t *)0x16327e;
        ipc_helper_bind_twice_cold_5();
LAB_0016327e:
        puStack_100 = (uv_pipe_t *)0x163283;
        ipc_helper_bind_twice_cold_6();
LAB_00163283:
        puStack_100 = (uv_pipe_t *)0x163288;
        ipc_helper_bind_twice_cold_7();
LAB_00163288:
        puStack_100 = (uv_pipe_t *)0x16328d;
        ipc_helper_bind_twice_cold_8();
LAB_0016328d:
        puStack_100 = (uv_pipe_t *)0x163292;
        ipc_helper_bind_twice_cold_9();
LAB_00163292:
        puStack_100 = (uv_pipe_t *)0x163297;
        ipc_helper_bind_twice_cold_10();
LAB_00163297:
        puStack_100 = (uv_pipe_t *)0x16329c;
        ipc_helper_bind_twice_cold_11();
LAB_0016329c:
        puStack_100 = (uv_pipe_t *)0x1632a1;
        ipc_helper_bind_twice_cold_12();
      }
      puStack_100 = (uv_pipe_t *)ipc_helper_send_zero;
      ipc_helper_bind_twice_cold_13();
      puStack_100 = puVar13;
      auStack_110 = uv_buf_init(0,0);
      uVar8 = uv_default_loop();
      puVar5 = &channel;
      iVar1 = uv_pipe_init(uVar8,&channel,0);
      if (iVar1 == 0) {
        puVar5 = (uv_pipe_t *)0x0;
        uv_pipe_open(&channel);
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_001633a9;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_001633ae;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_001633b3;
        puVar5 = &channel;
        iVar1 = uv_write(&write_req,&channel,auStack_110,1,send_zero_write_cb);
        if (iVar1 != 0) goto LAB_001633b8;
        uVar8 = uv_default_loop();
        puVar5 = (uv_pipe_t *)0x0;
        iVar1 = uv_run(uVar8);
        if (iVar1 != 0) goto LAB_001633bd;
        if (send_zero_write == 1) {
          uVar8 = uv_default_loop();
          uv_walk(uVar8,close_walk_cb,0);
          puVar5 = (uv_pipe_t *)0x0;
          uv_run(uVar8);
          uVar8 = uv_default_loop();
          iVar1 = uv_loop_close(uVar8);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_001633c7;
        }
      }
      else {
        ipc_helper_send_zero_cold_1();
LAB_001633a9:
        ipc_helper_send_zero_cold_2();
LAB_001633ae:
        ipc_helper_send_zero_cold_3();
LAB_001633b3:
        ipc_helper_send_zero_cold_4();
LAB_001633b8:
        ipc_helper_send_zero_cold_5();
LAB_001633bd:
        ipc_helper_send_zero_cold_6();
      }
      ipc_helper_send_zero_cold_7();
LAB_001633c7:
      ipc_helper_send_zero_cold_8();
      if ((int)puVar5 != 0) {
        send_zero_write_cb_cold_1();
        pvVar9 = malloc((size_t)puVar5);
        *extraout_RDX = pvVar9;
        extraout_RDX[1] = puVar5;
        return (int)pvVar9;
      }
      send_zero_write = send_zero_write + 1;
      return extraout_EAX_01;
    }
    if (0x12a < uVar15) break;
    uVar15 = uVar15 + 1;
    puVar13 = (uv_pipe_t *)puVar13->write_queue;
  } while (channel.write_queue_size == 0);
  return (int)channel.write_queue_size;
}

Assistant:

int ipc_helper(int listen_after_write) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel that we
   * over which a handle will be transmitted.
   */
  struct sockaddr_in addr;
  int r;
  uv_buf_t buf;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  if (!listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&write_req, (uv_stream_t*)&channel, &buf, 1,
      (uv_stream_t*)&tcp_server, NULL);
  ASSERT(r == 0);

  if (listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  notify_parent_process();
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connection_accepted == 1);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}